

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableEnumOneofFieldLiteGenerator::GenerateHashCode
          (ImmutableEnumOneofFieldLiteGenerator *this,Printer *printer)

{
  char *text;
  
  text = 
  "hash = (37 * hash) + $constant_name$;\nhash = (53 * hash) + get$capitalized_name$().getNumber();\n"
  ;
  if (*(int *)(*(long *)((this->super_ImmutableEnumFieldLiteGenerator).descriptor_ + 0x30) + 0x8c)
      == 3) {
    text = 
    "hash = (37 * hash) + $constant_name$;\nhash = (53 * hash) + get$capitalized_name$Value();\n";
  }
  io::Printer::Print(printer,&(this->super_ImmutableEnumFieldLiteGenerator).variables_,text);
  return;
}

Assistant:

void ImmutableEnumOneofFieldLiteGenerator::
GenerateHashCode(io::Printer* printer) const {
  if (SupportUnknownEnumValue(descriptor_->file())) {
    printer->Print(variables_,
      "hash = (37 * hash) + $constant_name$;\n"
      "hash = (53 * hash) + get$capitalized_name$Value();\n");
  } else {
    printer->Print(variables_,
      "hash = (37 * hash) + $constant_name$;\n"
      "hash = (53 * hash) + get$capitalized_name$().getNumber();\n");
  }
}